

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  string *psVar1;
  long lVar2;
  istream *piVar3;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar8;
  allocator local_469;
  string *local_468;
  string *local_460;
  string filepath_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string s;
  string filepath;
  stringstream ss;
  ostream local_3b0 [16];
  byte abStack_3a0 [488];
  istringstream f;
  ostream local_1a8 [376];
  
  psVar1 = &this->m_mtlBaseDir;
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    psVar5 = warn;
    std::__cxx11::string::string((string *)&filepath_1,matId);
    std::ifstream::ifstream(&ss,filepath_1._M_dataplus._M_p,_S_in);
    bVar8 = (abStack_3a0[*(long *)(_ss + -0x18)] & 5) == 0;
    if (bVar8) {
      LoadMtl(matMap,materials,(istream *)&ss,warn,psVar5);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&f);
      poVar4 = std::operator<<(local_1a8,"Material file [ ");
      poVar4 = std::operator<<(poVar4,(string *)&filepath_1);
      poVar4 = std::operator<<(poVar4," ] not found in a path : ");
      poVar4 = std::operator<<(poVar4,(string *)psVar1);
      std::endl<char,std::char_traits<char>>(poVar4);
      if (warn != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)warn);
        std::__cxx11::string::~string((string *)&s);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&f);
    }
    std::ifstream::~ifstream(&ss);
    std::__cxx11::string::~string((string *)&filepath_1);
  }
  else {
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar5 = warn;
    local_468 = matId;
    std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)psVar1,_S_in);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&f,(string *)&s,':');
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&paths,&s);
    }
    lVar6 = 0;
    uVar7 = 0;
    local_460 = warn;
    while( true ) {
      bVar8 = uVar7 < (ulong)((long)paths.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)paths.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (!bVar8) break;
      lVar2 = *(long *)((long)&(paths.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar6
                       );
      if (lVar2 == 0) {
        std::__cxx11::string::string((string *)&filepath,local_468);
      }
      else {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&((paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6);
        if ((__lhs->_M_dataplus)._M_p[lVar2 + -1] == '/') {
          std::operator+(&filepath,__lhs,local_468);
        }
        else {
          std::__cxx11::string::string((string *)&filepath_1,"/",&local_469);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         __lhs,&filepath_1);
          std::operator+(&filepath,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         local_468);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&filepath_1);
        }
      }
      std::ifstream::ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 filepath._M_dataplus._M_p,_S_in);
      if ((abStack_3a0[*(long *)(_ss + -0x18)] & 5) == 0) {
        LoadMtl(matMap,materials,(istream *)&ss,local_460,psVar5);
        std::ifstream::~ifstream(&ss);
        std::__cxx11::string::~string((string *)&filepath);
        goto LAB_00143da6;
      }
      std::ifstream::~ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
      std::__cxx11::string::~string((string *)&filepath);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_3b0,"Material file [ ");
    psVar5 = local_460;
    poVar4 = std::operator<<(poVar4,(string *)local_468);
    poVar4 = std::operator<<(poVar4," ] not found in a path : ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    if (psVar5 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)psVar5);
      std::__cxx11::string::~string((string *)&filepath_1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
LAB_00143da6:
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::istringstream::~istringstream((istringstream *)&f);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&paths);
  }
  return bVar8;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}